

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O0

size_t __thiscall
Kandinsky::BaseExpression::sizeOfAllNodes
          (BaseExpression *this,shared_ptr<Kandinsky::BaseExpression> *thisSharedPtr)

{
  long lVar1;
  long lVar2;
  size_type sVar3;
  undefined8 in_RSI;
  long *in_RDI;
  undefined1 local_40 [48];
  undefined8 local_10;
  
  local_10 = in_RSI;
  lVar1 = (**(code **)(*in_RDI + 0x38))();
  lVar2 = (**(code **)(*in_RDI + 0x48))();
  (**(code **)(*in_RDI + 0x18))(local_40,in_RDI,local_10);
  sVar3 = std::
          set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
          ::size((set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
                  *)0x117bf1);
  std::
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::~set((set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
          *)0x117c0f);
  return lVar1 + lVar2 * 0x30 + sVar3 * 0x58;
}

Assistant:

size_t BaseExpression::sizeOfAllNodes(
        const std::shared_ptr<BaseExpression>& thisSharedPtr) const
    {
        return sizeOfInternalNodes()
            + numberOfConstants() * sizeof(Constant)
            + variables(thisSharedPtr).size() * sizeof(VariableExpression);
    }